

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_adaptor.cpp
# Opt level: O0

void __thiscall
nivalis::ImGuiDrawListGraphicsAdaptor::rectangle
          (ImGuiDrawListGraphicsAdaptor *this,float x,float y,float w,float h,bool fill,color *c,
          float thickness)

{
  byte in_SIL;
  undefined8 *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float unaff_retaddr;
  ImDrawCornerFlags unaff_retaddr_00;
  float in_stack_00000008;
  ImU32 in_stack_0000000c;
  ImVec2 *in_stack_00000010;
  ImVec2 *in_stack_00000018;
  ImDrawList *in_stack_00000020;
  undefined8 in_stack_ffffffffffffff80;
  undefined8 uVar1;
  ImDrawCornerFlags rounding_corners;
  ImVec2 *in_stack_ffffffffffffff90;
  ImVec2 *in_stack_ffffffffffffff98;
  ImDrawList *in_stack_ffffffffffffffa0;
  ImVec2 local_54 [3];
  ImVec2 local_3c;
  ImVec2 local_34 [3];
  byte local_19;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  
  local_19 = in_SIL & 1;
  local_18 = in_XMM3_Da;
  local_14 = in_XMM2_Da;
  local_10 = in_XMM1_Da;
  local_c = in_XMM0_Da;
  if (local_19 == 0) {
    ImVec2::ImVec2(local_54,in_XMM0_Da,in_XMM1_Da);
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffa4,local_c + local_14,local_10 + local_18);
    ImColor::ImColor((ImColor *)in_stack_ffffffffffffff90,(float)((ulong)in_RDI >> 0x20),
                     SUB84(in_RDI,0),(float)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                     (float)in_stack_ffffffffffffff80);
    ImColor::operator_cast_to_unsigned_int((ImColor *)0x197340);
    ImDrawList::AddRect(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_0000000c,
                        in_stack_00000008,unaff_retaddr_00,unaff_retaddr);
  }
  else {
    uVar1 = *in_RDI;
    ImVec2::ImVec2(local_34,in_XMM0_Da,in_XMM1_Da);
    ImVec2::ImVec2(&local_3c,local_c + local_14,local_10 + local_18);
    ImColor::ImColor((ImColor *)in_stack_ffffffffffffff90,(float)((ulong)in_RDI >> 0x20),
                     SUB84(in_RDI,0),(float)((ulong)uVar1 >> 0x20),(float)uVar1);
    rounding_corners = (ImDrawCornerFlags)((ulong)uVar1 >> 0x20);
    ImColor::operator_cast_to_unsigned_int((ImColor *)0x197290);
    ImDrawList::AddRectFilled
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
               (ImU32)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0),rounding_corners);
  }
  return;
}

Assistant:

void ImGuiDrawListGraphicsAdaptor::rectangle(float x, float y, float w, float h,
                                             bool fill, const color::color& c,
                                             float thickness) {
    if (fill) {
        draw_list->AddRectFilled(ImVec2(x, y), ImVec2(x + w, y + h),
                                 ImColor(c.r, c.g, c.b, c.a));
    } else {
        draw_list->AddRect(ImVec2(x, y), ImVec2(x + w, y + h),
                           ImColor(c.r, c.g, c.b, c.a), 0.0f,
                           ImDrawCornerFlags_All, thickness);
    }
}